

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

bool __thiscall Polymer::CheckTermination(Polymer *this,int pol_index)

{
  key_type *name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  MobileElementManager *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  element_type *peVar4;
  pointer ppVar5;
  undefined8 uVar6;
  bool bVar7;
  mapped_type *pmVar8;
  SpeciesTracker *this_01;
  int iVar9;
  pointer pIVar10;
  bool bVar11;
  bool bVar12;
  pointer extraout_XMM0_Qa;
  Ptr pol;
  Ptr transcript;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [16];
  shared_ptr<PolymerWrapper> local_c0;
  shared_ptr<PolymerWrapper> local_b0;
  shared_ptr<PolymerWrapper> local_a0;
  _Alloc_hider local_90;
  double local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  Polymer *local_70;
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [16];
  intervalVector local_48;
  
  this_00 = &this->polymerases_;
  MobileElementManager::GetPol((MobileElementManager *)local_d0,(int)this_00);
  uVar6 = local_d0._0_8_;
  if (*(int *)(local_d0._0_8_ + 0x3c) < this->stop_) {
    local_48.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
              (&this->release_sites_,(long)*(int *)(local_d0._0_8_ + 0x38),
               (long)*(int *)(local_d0._0_8_ + 0x3c),&local_48);
    local_60 = local_48.
               super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar11 = local_48.
             super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_48.
             super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar11) {
      local_80._8_8_ = &this->termination_signal_;
      pIVar10 = local_48.
                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_70 = this;
      do {
        uVar6 = local_d0._0_8_;
        name = (key_type *)(local_d0._0_8_ + 0x18);
        bVar7 = ReleaseSite::CheckInteraction
                          ((pIVar10->value).
                           super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr,name,
                           *(int *)(local_d0._0_8_ + 0x50));
        if ((bVar7) &&
           ((((pIVar10->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_FixedElement).field_0x9d == '\0')) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,*(long *)(uVar6 + 0x58),
                     *(long *)(uVar6 + 0x60) + *(long *)(uVar6 + 0x58));
          peVar4 = (pIVar10->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (local_f0._M_string_length != (peVar4->super_FixedElement).gene_._M_string_length) {
            bVar7 = true;
            goto LAB_0011a2be;
          }
          bVar7 = true;
          if (local_f0._M_string_length == 0) {
            bVar12 = true;
          }
          else {
            iVar9 = bcmp(local_f0._M_dataplus._M_p,
                         (peVar4->super_FixedElement).gene_._M_dataplus._M_p,
                         local_f0._M_string_length);
            bVar12 = iVar9 == 0;
          }
        }
        else {
          bVar7 = false;
LAB_0011a2be:
          bVar12 = false;
        }
        if ((bVar7) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (bVar12) {
          Random::random();
          local_90._M_p = extraout_XMM0_Qa;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[](&(((pIVar10->value).
                                   super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->super_FixedElement).interactions_,name);
          local_68 = (pointer)*pmVar8;
          peVar4 = (pIVar10->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if ((double)local_90._M_p <= (double)local_68) {
            iVar9 = (peVar4->super_FixedElement).stop_;
            iVar3 = *(int *)(uVar6 + 0x3c);
            MobileElementManager::GetAttached((MobileElementManager *)local_58,(int)this_00);
            uVar6 = local_58._0_8_;
            if ((long *)local_58._0_8_ != (long *)0x0) {
              if (iVar3 <= iVar9) {
                iVar9 = (iVar9 - iVar3) + 1;
                do {
                  (**(code **)(*(long *)uVar6 + 0x10))(uVar6);
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
              }
              *(undefined1 *)(uVar6 + 0x111) = 0;
            }
            local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (local_70->wrapper_).
                    super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              iVar9 = (local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count;
              do {
                if (iVar9 == 0) {
                  local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  break;
                }
                LOCK();
                iVar3 = (local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count;
                bVar7 = iVar9 == iVar3;
                if (bVar7) {
                  (local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count = iVar9 + 1;
                  iVar3 = iVar9;
                }
                iVar9 = iVar3;
                UNLOCK();
              } while (!bVar7);
            }
            if (local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar7 = true;
            }
            else {
              bVar7 = (local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count == 0;
            }
            if (bVar7) {
              local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
            }
            else {
              local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (local_70->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
            }
            Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::Emit((Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)local_80._8_8_,&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_d0._0_8_ + 0x18),
                   &(((pIVar10->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_FixedElement).gene_);
            if (local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            MobileElementManager::Delete(this_00,pol_index);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
            }
          }
          else {
            iVar9 = (peVar4->super_FixedElement).covered_ + 1;
            (peVar4->super_FixedElement).covered_ = iVar9;
            (peVar4->super_FixedElement).old_covered_ = iVar9;
            (peVar4->super_FixedElement).field_0x9d = 1;
          }
          if ((double)local_90._M_p <= (double)local_68) break;
        }
        pIVar10 = pIVar10 + 1;
        bVar11 = pIVar10 != local_60;
      } while (bVar11);
    }
    std::
    vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ::~vector(&local_48);
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)(local_d0._0_8_ + 0x18));
    if (iVar9 == 0) {
      MobileElementManager::Delete(this_00,pol_index);
      this->degrade_ = true;
      bVar11 = true;
    }
    else {
      ppVar5 = (pointer)(this->wrapper_).
                        super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
      if (*(char *)(uVar6 + 0x78) == '\x01') {
        local_a0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar5;
        if (ppVar5 != (pointer)0x0) {
          iVar9 = *(int *)&(ppVar5->first).
                           super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
          do {
            if (iVar9 == 0) {
              local_a0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            p_Var1 = &(ppVar5->first).super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            LOCK();
            iVar3 = *(int *)&p_Var1->_M_pi;
            bVar11 = iVar9 == iVar3;
            if (bVar11) {
              *(int *)&p_Var1->_M_pi = iVar9 + 1;
              iVar3 = iVar9;
            }
            iVar9 = iVar3;
            UNLOCK();
          } while (!bVar11);
        }
        if ((pointer)local_a0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi == (pointer)0x0) {
          bVar11 = true;
        }
        else {
          bVar11 = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                            &(local_a0.
                              super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count)->_M_pi == 0;
        }
        if (bVar11) {
          local_a0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
        }
        else {
          local_a0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        paVar2 = &local_f0.field_2;
        local_f0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"NA","");
        Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::Emit(&this->termination_signal_,&local_a0,(string *)(local_d0._0_8_ + 0x18),&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((pointer)local_a0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        MobileElementManager::Delete(this_00,pol_index);
        this_01 = SpeciesTracker::Instance();
        SpeciesTracker::Increment(this_01,(string *)(local_d0._0_8_ + 0x18),-1);
        local_88 = (double)local_d0._0_8_;
        local_80._M_allocated_capacity = local_d0._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_d0._8_8_ + 8) = *(_Atomic_word *)(local_d0._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_d0._8_8_ + 8) = *(_Atomic_word *)(local_d0._8_8_ + 8) + 1;
          }
        }
        local_f0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"readthrough","");
        (*this->_vptr_Polymer[1])(this,&local_88,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        bVar11 = true;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_allocated_capacity !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_allocated_capacity)
          ;
        }
      }
      else {
        local_b0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar5;
        if (ppVar5 != (pointer)0x0) {
          iVar9 = *(int *)&(ppVar5->first).
                           super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
          do {
            if (iVar9 == 0) {
              local_b0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            p_Var1 = &(ppVar5->first).super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            LOCK();
            iVar3 = *(int *)&p_Var1->_M_pi;
            bVar11 = iVar9 == iVar3;
            if (bVar11) {
              *(int *)&p_Var1->_M_pi = iVar9 + 1;
              iVar3 = iVar9;
            }
            iVar9 = iVar3;
            UNLOCK();
          } while (!bVar11);
        }
        if ((pointer)local_b0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi == (pointer)0x0) {
          bVar11 = true;
        }
        else {
          bVar11 = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                            &(local_b0.
                              super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count)->_M_pi == 0;
        }
        if (bVar11) {
          local_b0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
        }
        else {
          local_b0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"NA","");
        Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::Emit(&this->termination_signal_,&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_d0._0_8_ + 0x18),&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((pointer)local_b0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        bVar11 = true;
        MobileElementManager::Delete(this_00,pol_index);
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
  }
  return bVar11;
}

Assistant:

bool Polymer::CheckTermination(int pol_index) {
  auto pol = polymerases_.GetPol(pol_index);
  if (pol->stop() >= stop_) {
    if (pol->name() == "__rnase") {
      // std::cout << "rnase ran off end of transcript" << std::endl;
      polymerases_.Delete(pol_index);
      degrade_ = true;
      return true;
    } else if (pol->polymerasereadthrough()) {
      // Create a new transcript and unbind/rebind pol so that
      // all necessary checks still occur
      termination_signal_.Emit(wrapper(), pol->name(), "NA");
      polymerases_.Delete(pol_index);
      // The termination signal increments the pol count by 1,
      // so decrement it here since the polymerase was actually
      // just moved to the beginning of the genome
      SpeciesTracker::Instance().Increment(pol->name(), -1);
      Bind(pol, "readthrough"); 
      return true;
    } else {
      termination_signal_.Emit(wrapper(), pol->name(), "NA");
      polymerases_.Delete(pol_index);
      return true;
    }
  }
  std::vector<Interval<ReleaseSite::Ptr>> results;
  release_sites_.findOverlapping(pol->start(), pol->stop(), results);
  for (auto &interval : results) {
    if (interval.value->CheckInteraction(pol->name(), pol->reading_frame()) &&
        !interval.value->readthrough() &&
        pol->gene_bound() == interval.value->gene()) {
      // terminate
      // std::cout << pol->name() + " " + interval.value->name() << std::endl;
      double random_num = Random::random();
      if (random_num <= interval.value->efficiency(pol->name())) {
        // std::cout << pol->name() + " terminating" << std::endl;
        // Fire Emit signal until entire terminator is uncovered
        // Coordinates are inclusive, so must add 1 after calculating
        // difference
        int dist = interval.value->stop() - pol->stop() + 1;
        auto transcript = polymerases_.GetAttached(pol_index);
        if (transcript != nullptr) {
          for (int i = 0; i < dist; i++) {
            transcript->ShiftMask();
          }
          transcript->attached(false);
        }
        termination_signal_.Emit(wrapper(), pol->name(),
                                 interval.value->gene());
        polymerases_.Delete(pol_index);
        return true;
      } else {
        interval.value->Cover();
        interval.value->ResetState();
        // std::cout << "Readthrough set to true!" << std::endl;
        interval.value->readthrough(true);
      }
    }
  }
  return false;
}